

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setop_relation.cpp
# Opt level: O1

void __thiscall
duckdb::SetOpRelation::SetOpRelation
          (SetOpRelation *this,shared_ptr<duckdb::Relation,_true> *left_p,
          shared_ptr<duckdb::Relation,_true> *right_p,SetOperationType setop_type_p,bool setop_all)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Alloc_hider _Var3;
  Relation *pRVar4;
  InvalidInputException *this_00;
  string local_60;
  _func_int **local_40;
  element_type *local_38;
  
  pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->(left_p);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,anon_var_dwarf_4f001a4 + 9);
  Relation::Relation(&this->super_Relation,&pRVar4->context,SET_OPERATION_RELATION,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  (this->super_Relation)._vptr_Relation = (_func_int **)&PTR__SetOpRelation_024a5260;
  (this->left).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (left_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (left_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (left_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->left).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->left).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var2;
  (left_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->right).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (right_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (right_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (right_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->right).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->right).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (right_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this->setop_type = setop_type_p;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->setop_all = setop_all;
  pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->(&this->left);
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->(&pRVar4->context);
  ClientContextWrapper::GetContext((ClientContextWrapper *)&local_60);
  pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->(&this->right);
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->(&pRVar4->context);
  ClientContextWrapper::GetContext((ClientContextWrapper *)&local_40);
  _Var3._M_p = local_60._M_dataplus._M_p;
  if (local_38 != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length);
  }
  if ((_func_int **)_Var3._M_p == local_40) {
    Relation::TryBindRelation(&this->super_Relation,&this->columns);
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Cannot combine LEFT and RIGHT relations of different connections!"
             ,"");
  InvalidInputException::InvalidInputException(this_00,(string *)&local_60);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SetOpRelation::SetOpRelation(shared_ptr<Relation> left_p, shared_ptr<Relation> right_p, SetOperationType setop_type_p,
                             bool setop_all)
    : Relation(left_p->context, RelationType::SET_OPERATION_RELATION), left(std::move(left_p)),
      right(std::move(right_p)), setop_type(setop_type_p), setop_all(setop_all) {
	if (left->context->GetContext() != right->context->GetContext()) {
		throw InvalidInputException("Cannot combine LEFT and RIGHT relations of different connections!");
	}
	TryBindRelation(columns);
}